

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btcp.c
# Opt level: O1

void nn_btcp_destroy(nn_epbase *self)

{
  nn_usock *self_00;
  int iVar1;
  int iVar2;
  nn_atcp *pnVar3;
  char *pcVar4;
  char *pcVar5;
  size_t sVar6;
  nn_ctx *ctx;
  ulong extraout_RAX;
  nn_list_item *pnVar7;
  nn_list_item *pnVar8;
  nn_fsm *pnVar9;
  nn_atcp *self_01;
  uint *self_02;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint uVar10;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint uVar11;
  uint extraout_EDX_03;
  long *in_RSI;
  nn_ctx **ppnVar12;
  nn_btcp *pnVar13;
  nn_fsm *pnVar14;
  nn_epbase *unaff_R14;
  int iStack_1ec;
  size_t sStack_1e8;
  size_t sStack_1e0;
  sockaddr_storage sStack_1d8;
  nn_fsm *pnStack_150;
  ulong uStack_148;
  char *pcStack_140;
  nn_fsm *pnStack_138;
  nn_atcp *pnStack_130;
  code *pcStack_128;
  nn_btcp *pnStack_120;
  nn_fsm_fn *pp_Stack_118;
  nn_atcp *pnStack_110;
  nn_atcp *pnStack_108;
  code *pcStack_100;
  nn_epbase **ppnStack_f0;
  nn_atcp *pnStack_e8;
  undefined1 auStack_dc [8];
  int iStack_d4;
  nn_fsm_fn p_Stack_d0;
  size_t sStack_c8;
  size_t sStack_c0;
  sockaddr_storage sStack_b8;
  nn_fsm *pnStack_38;
  
  pnVar9 = (nn_fsm *)(self + -6);
  if (self == (nn_epbase *)0x0) {
    pnVar9 = (nn_fsm *)0x0;
  }
  ppnVar12 = (nn_ctx **)(ulong)*(uint *)&pnVar9[1].fn;
  if (*(uint *)&pnVar9[1].fn == 1) {
    ppnVar12 = &pnVar9[8].ctx;
    nn_list_term((nn_list *)ppnVar12);
    if (pnVar9[8].owner == (nn_fsm *)0x0) {
      nn_usock_term((nn_usock *)&pnVar9[1].srcptr);
      nn_backoff_term((nn_backoff *)&pnVar9[8].stopped.src);
      nn_epbase_term((nn_epbase *)&pnVar9[1].shutdown_fn);
      nn_fsm_term(pnVar9);
      nn_free(pnVar9);
      return;
    }
  }
  else {
    nn_btcp_destroy_cold_1();
  }
  nn_btcp_destroy_cold_2();
  pnStack_e8 = (nn_atcp *)0x12c064;
  pnStack_38 = pnVar9;
  pnVar3 = (nn_atcp *)nn_alloc_(0x3f0);
  if (pnVar3 == (nn_atcp *)0x0) {
    pnStack_e8 = (nn_atcp *)0x12c235;
    nn_btcp_create_cold_4();
LAB_0012c235:
    pnStack_e8 = (nn_atcp *)0x12c23a;
    nn_btcp_create_cold_1();
LAB_0012c23a:
    pnStack_e8 = (nn_atcp *)0x12c242;
    nn_epbase_term(unaff_R14);
    return;
  }
  unaff_R14 = (nn_epbase *)&pnVar3->epbase;
  pnStack_e8 = (nn_atcp *)0x12c086;
  nn_epbase_init(unaff_R14,&nn_btcp_epbase_vfptr,ppnVar12);
  pnStack_e8 = (nn_atcp *)0x12c08e;
  pcVar4 = nn_epbase_getaddr(unaff_R14);
  pnStack_e8 = (nn_atcp *)0x12c09e;
  pcVar5 = strrchr(pcVar4,0x3a);
  if (pcVar5 == (char *)0x0) {
LAB_0012c221:
    pnStack_e8 = (nn_atcp *)0x12c229;
    nn_epbase_term(unaff_R14);
    return;
  }
  pnStack_e8 = (nn_atcp *)0x12c0b2;
  sVar6 = strlen(pcVar4);
  pcVar5 = pcVar5 + 1;
  pnStack_e8 = (nn_atcp *)0x12c0c4;
  iVar1 = nn_port_resolve(pcVar5,(size_t)(pcVar4 + (sVar6 - (long)pcVar5)));
  if (iVar1 < 0) goto LAB_0012c221;
  sStack_c8 = 4;
  pnStack_e8 = (nn_atcp *)0x12c0f0;
  nn_epbase_getopt(unaff_R14,0,0xe,&iStack_d4,&sStack_c8);
  if (sStack_c8 != 4) goto LAB_0012c235;
  pnStack_e8 = (nn_atcp *)0x12c11d;
  iVar1 = nn_iface_resolve(pcVar4,(size_t)(pcVar5 + ~(ulong)pcVar4),iStack_d4,&sStack_b8,&sStack_c0)
  ;
  if (iVar1 < 0) goto LAB_0012c23a;
  pnStack_e8 = (nn_atcp *)0x12c12d;
  ctx = nn_epbase_getctx(unaff_R14);
  pnStack_e8 = (nn_atcp *)0x12c146;
  nn_fsm_init_root((nn_fsm *)pnVar3,nn_btcp_handler,nn_btcp_shutdown,ctx);
  pnVar3->state = 1;
  p_Stack_d0 = (nn_fsm_fn)0x4;
  self_01 = (nn_atcp *)(auStack_dc + 4);
  iVar1 = 0;
  pnStack_e8 = (nn_atcp *)0x12c172;
  pnVar13 = (nn_btcp *)unaff_R14;
  nn_epbase_getopt(unaff_R14,0,6,self_01,(size_t *)&p_Stack_d0);
  if (p_Stack_d0 == (nn_fsm_fn)0x4) {
    p_Stack_d0 = (nn_fsm_fn)0x4;
    self_01 = (nn_atcp *)auStack_dc;
    iVar1 = 0;
    pnStack_e8 = (nn_atcp *)0x12c1a1;
    pnVar13 = (nn_btcp *)unaff_R14;
    nn_epbase_getopt(unaff_R14,0,7,self_01,(size_t *)&p_Stack_d0);
    if (p_Stack_d0 == (nn_fsm_fn)0x4) {
      if (auStack_dc._0_4_ == 0) {
        auStack_dc._0_4_ = auStack_dc._4_4_;
      }
      pnStack_e8 = (nn_atcp *)0x12c1d7;
      nn_backoff_init((nn_backoff *)&(pnVar3->stcp).fsm.shutdown_fn,3,auStack_dc._4_4_,
                      auStack_dc._0_4_,(nn_fsm *)pnVar3);
      pnStack_e8 = (nn_atcp *)0x12c1e8;
      nn_usock_init((nn_usock *)&(pnVar3->usock).fsm.shutdown_fn,1,(nn_fsm *)pnVar3);
      *(undefined8 *)&pnVar3->listener_owner = 0;
      pnStack_e8 = (nn_atcp *)0x12c202;
      nn_list_init((nn_list *)&(pnVar3->listener_owner).fsm);
      pnStack_e8 = (nn_atcp *)0x12c20a;
      nn_fsm_start((nn_fsm *)pnVar3);
      *in_RSI = (long)unaff_R14;
      return;
    }
  }
  else {
    pnStack_e8 = (nn_atcp *)0x12c24e;
    nn_btcp_create_cold_2();
  }
  pnStack_e8 = (nn_atcp *)nn_btcp_handler;
  nn_btcp_create_cold_3();
  self_02 = &switchD_0012c27b::switchdataD_001353f8;
  uVar10 = extraout_EDX;
  ppnStack_f0 = (nn_epbase **)unaff_R14;
  pnStack_e8 = pnVar3;
  switch(pnVar13->state) {
  case 1:
    if (iVar1 == -2) {
      if (extraout_EDX == 0xfffffffe) goto LAB_0012c2a4;
      pcStack_100 = (code *)0x12c292;
      nn_btcp_handler_cold_11();
      uVar10 = extraout_EDX_00;
      goto switchD_0012c27b_caseD_9;
    }
LAB_0012c3d1:
    pcStack_100 = (code *)0x12c3da;
    nn_btcp_handler_cold_10();
    break;
  case 2:
    pnVar3 = pnVar13->atcp;
    if (pnVar3 == self_01) {
      if (extraout_EDX == 0x85b7) {
        pcStack_100 = (code *)0x12c360;
        pnVar7 = nn_list_end(&pnVar13->atcps);
        pcStack_100 = (code *)0x12c36e;
        nn_list_insert(&pnVar13->atcps,&pnVar3->item,pnVar7);
        pnVar13->atcp = (nn_atcp *)0x0;
        nn_btcp_start_accepting(pnVar13);
        return;
      }
      goto LAB_0012c3f4;
    }
    if (iVar1 != 2) {
      pcStack_100 = (code *)0x12c3b6;
      nn_btcp_handler_cold_7();
      goto LAB_0012c3b6;
    }
    if (extraout_EDX == 0x85b9) {
      pcStack_100 = (code *)0x12c39c;
      nn_list_erase(&pnVar13->atcps,&self_01->item);
      pcStack_100 = (code *)0x12c3a4;
      nn_atcp_term(self_01);
      nn_free(self_01);
      return;
    }
    uVar10 = 2;
    uVar11 = extraout_EDX;
    if (extraout_EDX == 0x85b8) {
      nn_atcp_stop(self_01);
      return;
    }
    goto LAB_0012c3fd;
  default:
    goto switchD_0012c27b_caseD_3;
  case 7:
    if (iVar1 != 3) goto LAB_0012c3bf;
    if (extraout_EDX == 1) {
      pcStack_100 = (code *)0x12c2cf;
      nn_backoff_stop(&pnVar13->retry);
      pnVar13->state = 9;
      return;
    }
    goto LAB_0012c3e1;
  case 8:
    if (iVar1 != 1) goto LAB_0012c3c8;
    if (extraout_EDX == 8) {
      return;
    }
    if (extraout_EDX == 7) {
      pcStack_100 = (code *)0x12c2fb;
      nn_backoff_start(&pnVar13->retry);
      pnVar13->state = 7;
      return;
    }
    goto LAB_0012c3ed;
  case 9:
switchD_0012c27b_caseD_9:
    if (iVar1 != 3) {
LAB_0012c3b6:
      pcStack_100 = (code *)0x12c3bf;
      nn_btcp_handler_cold_1();
LAB_0012c3bf:
      pcStack_100 = (code *)0x12c3c8;
      nn_btcp_handler_cold_3();
LAB_0012c3c8:
      pcStack_100 = (code *)0x12c3d1;
      nn_btcp_handler_cold_5();
      goto LAB_0012c3d1;
    }
    if (uVar10 == 2) {
LAB_0012c2a4:
      nn_btcp_start_listening(pnVar13);
      return;
    }
  }
  pcStack_100 = (code *)0x12c3e1;
  nn_btcp_handler_cold_2();
LAB_0012c3e1:
  pcStack_100 = (code *)0x12c3e8;
  nn_btcp_handler_cold_4();
switchD_0012c27b_caseD_3:
  pcStack_100 = (code *)0x12c3ed;
  nn_btcp_handler_cold_12();
LAB_0012c3ed:
  pcStack_100 = (code *)0x12c3f4;
  nn_btcp_handler_cold_6();
  uVar10 = extraout_EDX_01;
LAB_0012c3f4:
  pcStack_100 = (code *)0x12c3fd;
  nn_btcp_handler_cold_9();
  uVar11 = extraout_EDX_02;
LAB_0012c3fd:
  pnVar9 = (nn_fsm *)(ulong)uVar10;
  pcStack_100 = nn_btcp_shutdown;
  nn_btcp_handler_cold_8();
  pnStack_120 = pnVar13;
  pp_Stack_118 = &p_Stack_d0;
  pnStack_110 = self_01;
  pnStack_108 = pnVar3;
  pcStack_100 = (code *)&sStack_c8;
  if (extraout_EDX_03 == 0xfffffffd && uVar11 == 0xfffffffe) goto LAB_0012c44c;
  while( true ) {
    pnVar14 = pnVar9 + 1;
    if (*(int *)&pnVar9[1].fn == 3) {
      pcStack_128 = (code *)0x12c461;
      nn_btcp_shutdown_cold_2();
      if ((extraout_RAX & 1) != 0) {
        return;
      }
    }
    uVar10 = *(uint *)&pnVar14->fn;
    pnVar13 = (nn_btcp *)(ulong)uVar10;
    if (uVar10 == 4) {
      pcStack_128 = (code *)0x12c473;
      iVar1 = nn_usock_isidle((nn_usock *)&pnVar9[1].srcptr);
      if (iVar1 == 0) {
        return;
      }
      pcStack_128 = (code *)0x12c487;
      iVar1 = nn_backoff_isidle((nn_backoff *)&pnVar9[8].stopped.src);
      if (iVar1 == 0) {
        return;
      }
      ppnVar12 = &pnVar9[8].ctx;
      pcStack_128 = (code *)0x12c49e;
      pnVar7 = nn_list_begin((nn_list *)ppnVar12);
      while( true ) {
        pcStack_128 = (code *)0x12c4a9;
        pnVar8 = nn_list_end((nn_list *)ppnVar12);
        if (pnVar7 == pnVar8) break;
        pnVar3 = (nn_atcp *)(pnVar7 + -0x73);
        if (pnVar7 == (nn_list_item *)0x0) {
          pnVar3 = (nn_atcp *)0x0;
        }
        pcStack_128 = (code *)0x12c4c2;
        nn_atcp_stop(pnVar3);
        pcStack_128 = (code *)0x12c4cd;
        pnVar7 = nn_list_next((nn_list *)ppnVar12,pnVar7);
      }
      *(undefined4 *)&pnVar14->fn = 5;
      goto LAB_0012c509;
    }
    if (uVar10 == 5) break;
    pcStack_128 = (code *)0x12c44c;
    nn_btcp_shutdown_cold_4();
LAB_0012c44c:
    pcStack_128 = (code *)0x12c454;
    nn_btcp_shutdown_cold_1();
  }
  if ((uVar11 == 2) && (extraout_EDX_03 == 0x85b9)) {
    pcStack_128 = (code *)0x12c4f0;
    nn_list_erase((nn_list *)&pnVar9[8].ctx,&((nn_atcp *)self_02)->item);
    pcStack_128 = (code *)0x12c4f8;
    nn_atcp_term((nn_atcp *)self_02);
    pcStack_128 = (code *)0x12c500;
    nn_free(self_02);
LAB_0012c509:
    pcStack_128 = (code *)0x12c515;
    iVar1 = nn_list_empty((nn_list *)&pnVar9[8].ctx);
    if (iVar1 == 0) {
      return;
    }
    *(undefined4 *)&pnVar9[1].fn = 1;
    pcStack_128 = (code *)0x12c528;
    nn_fsm_stopped_noevent(pnVar9);
    nn_epbase_stopped((nn_epbase *)&pnVar9[1].shutdown_fn);
    return;
  }
  pcStack_128 = nn_btcp_start_listening;
  nn_btcp_shutdown_cold_3();
  pnStack_150 = pnVar9;
  uStack_148 = (ulong)uVar11;
  pcStack_140 = pcVar5 + ~(ulong)pcVar4;
  pnStack_138 = pnVar14;
  pnStack_130 = (nn_atcp *)self_02;
  pcStack_128 = (code *)(ulong)extraout_EDX_03;
  pnVar9 = (nn_fsm *)nn_epbase_getaddr(&pnVar13->epbase);
  sStack_1d8.ss_family = 0;
  sStack_1d8.__ss_padding[0] = '\0';
  sStack_1d8.__ss_padding[1] = '\0';
  sStack_1d8.__ss_padding[2] = '\0';
  sStack_1d8.__ss_padding[3] = '\0';
  sStack_1d8.__ss_padding[4] = '\0';
  sStack_1d8.__ss_padding[5] = '\0';
  sStack_1d8.__ss_padding[6] = '\0';
  sStack_1d8.__ss_padding[7] = '\0';
  sStack_1d8.__ss_padding[8] = '\0';
  sStack_1d8.__ss_padding[9] = '\0';
  sStack_1d8.__ss_padding[10] = '\0';
  sStack_1d8.__ss_padding[0xb] = '\0';
  sStack_1d8.__ss_padding[0xc] = '\0';
  sStack_1d8.__ss_padding[0xd] = '\0';
  sStack_1d8.__ss_padding[0xe] = '\0';
  sStack_1d8.__ss_padding[0xf] = '\0';
  sStack_1d8.__ss_padding[0x10] = '\0';
  sStack_1d8.__ss_padding[0x11] = '\0';
  sStack_1d8.__ss_padding[0x12] = '\0';
  sStack_1d8.__ss_padding[0x13] = '\0';
  sStack_1d8.__ss_padding[0x14] = '\0';
  sStack_1d8.__ss_padding[0x15] = '\0';
  sStack_1d8.__ss_padding[0x16] = '\0';
  sStack_1d8.__ss_padding[0x17] = '\0';
  sStack_1d8.__ss_padding[0x18] = '\0';
  sStack_1d8.__ss_padding[0x19] = '\0';
  sStack_1d8.__ss_padding[0x1a] = '\0';
  sStack_1d8.__ss_padding[0x1b] = '\0';
  sStack_1d8.__ss_padding[0x1c] = '\0';
  sStack_1d8.__ss_padding[0x1d] = '\0';
  sStack_1d8.__ss_padding[0x1e] = '\0';
  sStack_1d8.__ss_padding[0x1f] = '\0';
  sStack_1d8.__ss_padding[0x20] = '\0';
  sStack_1d8.__ss_padding[0x21] = '\0';
  sStack_1d8.__ss_padding[0x22] = '\0';
  sStack_1d8.__ss_padding[0x23] = '\0';
  sStack_1d8.__ss_padding[0x24] = '\0';
  sStack_1d8.__ss_padding[0x25] = '\0';
  sStack_1d8.__ss_padding[0x26] = '\0';
  sStack_1d8.__ss_padding[0x27] = '\0';
  sStack_1d8.__ss_padding[0x28] = '\0';
  sStack_1d8.__ss_padding[0x29] = '\0';
  sStack_1d8.__ss_padding[0x2a] = '\0';
  sStack_1d8.__ss_padding[0x2b] = '\0';
  sStack_1d8.__ss_padding[0x2c] = '\0';
  sStack_1d8.__ss_padding[0x2d] = '\0';
  sStack_1d8.__ss_padding[0x2e] = '\0';
  sStack_1d8.__ss_padding[0x2f] = '\0';
  sStack_1d8.__ss_padding[0x30] = '\0';
  sStack_1d8.__ss_padding[0x31] = '\0';
  sStack_1d8.__ss_padding[0x32] = '\0';
  sStack_1d8.__ss_padding[0x33] = '\0';
  sStack_1d8.__ss_padding[0x34] = '\0';
  sStack_1d8.__ss_padding[0x35] = '\0';
  sStack_1d8.__ss_padding[0x36] = '\0';
  sStack_1d8.__ss_padding[0x37] = '\0';
  sStack_1d8.__ss_padding[0x38] = '\0';
  sStack_1d8.__ss_padding[0x39] = '\0';
  sStack_1d8.__ss_padding[0x3a] = '\0';
  sStack_1d8.__ss_padding[0x3b] = '\0';
  sStack_1d8.__ss_padding[0x3c] = '\0';
  sStack_1d8.__ss_padding[0x3d] = '\0';
  sStack_1d8.__ss_padding[0x3e] = '\0';
  sStack_1d8.__ss_padding[0x3f] = '\0';
  sStack_1d8.__ss_padding[0x40] = '\0';
  sStack_1d8.__ss_padding[0x41] = '\0';
  sStack_1d8.__ss_padding[0x42] = '\0';
  sStack_1d8.__ss_padding[0x43] = '\0';
  sStack_1d8.__ss_padding[0x44] = '\0';
  sStack_1d8.__ss_padding[0x45] = '\0';
  sStack_1d8.__ss_padding[0x46] = '\0';
  sStack_1d8.__ss_padding[0x47] = '\0';
  sStack_1d8.__ss_padding[0x48] = '\0';
  sStack_1d8.__ss_padding[0x49] = '\0';
  sStack_1d8.__ss_padding[0x4a] = '\0';
  sStack_1d8.__ss_padding[0x4b] = '\0';
  sStack_1d8.__ss_padding[0x4c] = '\0';
  sStack_1d8.__ss_padding[0x4d] = '\0';
  sStack_1d8.__ss_padding[0x4e] = '\0';
  sStack_1d8.__ss_padding[0x4f] = '\0';
  sStack_1d8.__ss_padding[0x50] = '\0';
  sStack_1d8.__ss_padding[0x51] = '\0';
  sStack_1d8.__ss_padding[0x52] = '\0';
  sStack_1d8.__ss_padding[0x53] = '\0';
  sStack_1d8.__ss_padding[0x54] = '\0';
  sStack_1d8.__ss_padding[0x55] = '\0';
  sStack_1d8.__ss_padding[0x56] = '\0';
  sStack_1d8.__ss_padding[0x57] = '\0';
  sStack_1d8.__ss_padding[0x58] = '\0';
  sStack_1d8.__ss_padding[0x59] = '\0';
  sStack_1d8.__ss_padding[0x5a] = '\0';
  sStack_1d8.__ss_padding[0x5b] = '\0';
  sStack_1d8.__ss_padding[0x5c] = '\0';
  sStack_1d8.__ss_padding[0x5d] = '\0';
  sStack_1d8.__ss_padding[0x5e] = '\0';
  sStack_1d8.__ss_padding[0x5f] = '\0';
  sStack_1d8.__ss_padding[0x60] = '\0';
  sStack_1d8.__ss_padding[0x61] = '\0';
  sStack_1d8.__ss_padding[0x62] = '\0';
  sStack_1d8.__ss_padding[99] = '\0';
  sStack_1d8.__ss_padding[100] = '\0';
  sStack_1d8.__ss_padding[0x65] = '\0';
  sStack_1d8.__ss_padding[0x66] = '\0';
  sStack_1d8.__ss_padding[0x67] = '\0';
  sStack_1d8.__ss_padding[0x68] = '\0';
  sStack_1d8.__ss_padding[0x69] = '\0';
  sStack_1d8.__ss_padding[0x6a] = '\0';
  sStack_1d8.__ss_padding[0x6b] = '\0';
  sStack_1d8.__ss_padding[0x6c] = '\0';
  sStack_1d8.__ss_padding[0x6d] = '\0';
  sStack_1d8.__ss_padding[0x6e] = '\0';
  sStack_1d8.__ss_padding[0x6f] = '\0';
  sStack_1d8.__ss_padding[0x70] = '\0';
  sStack_1d8.__ss_padding[0x71] = '\0';
  sStack_1d8.__ss_padding[0x72] = '\0';
  sStack_1d8.__ss_padding[0x73] = '\0';
  sStack_1d8.__ss_padding[0x74] = '\0';
  sStack_1d8.__ss_padding[0x75] = '\0';
  sStack_1d8.__ss_align = 0;
  pcVar4 = strrchr((char *)pnVar9,0x3a);
  if (pcVar4 == (char *)0x0) {
    nn_btcp_start_listening_cold_5();
LAB_0012c6d4:
    nn_btcp_start_listening_cold_4();
LAB_0012c6d9:
    nn_btcp_start_listening_cold_1();
  }
  else {
    sVar6 = strlen((char *)pnVar9);
    pcVar4 = pcVar4 + 1;
    iVar1 = nn_port_resolve(pcVar4,(size_t)((long)pnVar9 + (sVar6 - (long)pcVar4)));
    if (iVar1 < 0) goto LAB_0012c6d4;
    sStack_1e0 = 4;
    nn_epbase_getopt(&pnVar13->epbase,0,0xe,&iStack_1ec,&sStack_1e0);
    if (sStack_1e0 != 4) goto LAB_0012c6d9;
    iVar2 = nn_iface_resolve((char *)pnVar9,(size_t)(pcVar4 + ~(ulong)pnVar9),iStack_1ec,&sStack_1d8
                             ,&sStack_1e8);
    if (iVar2 == 0) {
      sStack_1e8 = 0x10;
      if (sStack_1d8.ss_family != 2) {
        if (sStack_1d8.ss_family != 10) {
          nn_btcp_start_listening_cold_3();
          if (pnVar9[8].owner == (nn_fsm *)0x0) {
            pnVar14 = (nn_fsm *)0x740;
            pnVar3 = (nn_atcp *)nn_alloc_(0x740);
            pnVar9[8].owner = (nn_fsm *)pnVar3;
            if (pnVar3 != (nn_atcp *)0x0) {
              nn_atcp_init(pnVar3,2,(nn_epbase *)&pnVar9[1].shutdown_fn,pnVar9);
              nn_atcp_start((nn_atcp *)pnVar9[8].owner,(nn_usock *)&pnVar9[1].srcptr);
              return;
            }
          }
          else {
            nn_btcp_start_accepting_cold_1();
            pnVar14 = pnVar9;
          }
          nn_btcp_start_accepting_cold_2();
          if (pnVar14 != (nn_fsm *)0x0) {
            pnVar14 = (nn_fsm *)&pnVar14[-2].stopped.item;
          }
          nn_fsm_stop(pnVar14);
          return;
        }
        sStack_1e8 = 0x1c;
      }
      sStack_1d8.__ss_padding._0_2_ = (ushort)iVar1 << 8 | (ushort)iVar1 >> 8;
      self_00 = &pnVar13->usock;
      iVar1 = nn_usock_start(self_00,(uint)sStack_1d8.ss_family,1,0);
      if (-1 < iVar1) {
        iVar1 = nn_usock_bind(self_00,(sockaddr *)&sStack_1d8,sStack_1e8);
        if ((-1 < iVar1) && (iVar1 = nn_usock_listen(self_00,100), -1 < iVar1)) {
          nn_btcp_start_accepting(pnVar13);
          pnVar13->state = 2;
          return;
        }
        nn_usock_stop(self_00);
        pnVar13->state = 8;
        return;
      }
      goto LAB_0012c6e5;
    }
  }
  nn_btcp_start_listening_cold_2();
LAB_0012c6e5:
  nn_backoff_start(&pnVar13->retry);
  pnVar13->state = 7;
  return;
}

Assistant:

static void nn_btcp_destroy (struct nn_epbase *self)
{
    struct nn_btcp *btcp;

    btcp = nn_cont (self, struct nn_btcp, epbase);

    nn_assert_state (btcp, NN_BTCP_STATE_IDLE);
    nn_list_term (&btcp->atcps);
    nn_assert (btcp->atcp == NULL);
    nn_usock_term (&btcp->usock);
    nn_backoff_term (&btcp->retry);
    nn_epbase_term (&btcp->epbase);
    nn_fsm_term (&btcp->fsm);

    nn_free (btcp);
}